

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O2

void __thiscall
spirv_cross::SmallVector<spirv_cross::Resource,_8UL>::clear
          (SmallVector<spirv_cross::Resource,_8UL> *this)

{
  long lVar1;
  size_t i;
  ulong uVar2;
  
  lVar1 = 0x10;
  for (uVar2 = 0; uVar2 < (this->super_VectorView<spirv_cross::Resource>).buffer_size;
      uVar2 = uVar2 + 1) {
    ::std::__cxx11::string::~string
              ((string *)
               ((long)&(((this->super_VectorView<spirv_cross::Resource>).ptr)->id).id + lVar1));
    lVar1 = lVar1 + 0x30;
  }
  (this->super_VectorView<spirv_cross::Resource>).buffer_size = 0;
  return;
}

Assistant:

void clear() SPIRV_CROSS_NOEXCEPT
	{
		for (size_t i = 0; i < this->buffer_size; i++)
			this->ptr[i].~T();
		this->buffer_size = 0;
	}